

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDASensEwtSetEE(IDAMem IDA_mem,N_Vector *yScur,N_Vector *weightS)

{
  undefined8 uVar1;
  int iVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int flag;
  N_Vector pyS;
  int is;
  int local_24;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x2c8);
  local_24 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0xa0) <= local_24) {
      return 0;
    }
    N_VScale(*(undefined8 *)(*(long *)(in_RDI + 200) + (long)local_24 * 8),
             *(undefined8 *)(in_RSI + (long)local_24 * 8),uVar1);
    iVar2 = (**(code **)(in_RDI + 0x48))
                      (uVar1,*(undefined8 *)(in_RDX + (long)local_24 * 8),
                       *(undefined8 *)(in_RDI + 0x50));
    if (iVar2 != 0) break;
    N_VScale(*(undefined8 *)(*(long *)(in_RDI + 200) + (long)local_24 * 8),
             *(undefined8 *)(in_RDX + (long)local_24 * 8),
             *(undefined8 *)(in_RDX + (long)local_24 * 8));
    local_24 = local_24 + 1;
  }
  return -1;
}

Assistant:

static int IDASensEwtSetEE(IDAMem IDA_mem, N_Vector* yScur, N_Vector* weightS)
{
  int is;
  N_Vector pyS;
  int flag;

  /* Use tempv1 as temporary storage for the scaled sensitivity */
  pyS = IDA_mem->ida_tempv1;

  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    N_VScale(IDA_mem->ida_pbar[is], yScur[is], pyS);
    flag = IDA_mem->ida_efun(pyS, weightS[is], IDA_mem->ida_edata);
    if (flag != 0) { return (-1); }
    N_VScale(IDA_mem->ida_pbar[is], weightS[is], weightS[is]);
  }

  return (0);
}